

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall capnp::SchemaLoader::Validator::Validator(Validator *this,Impl *loader)

{
  this->loader = loader;
  (this->nodeName).super_StringPtr.content.ptr = "";
  (this->nodeName).super_StringPtr.content.size_ = 1;
  kj::
  Table<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::TreeIndex<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
  ::Table(&(this->dependencies).table);
  kj::
  Table<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry,_kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Callbacks>_>
  ::Table(&(this->members).table);
  (this->membersByDiscriminant).ptr = (unsigned_short *)0x0;
  (this->membersByDiscriminant).size_ = 0;
  return;
}

Assistant:

Validator(SchemaLoader::Impl& loader): loader(loader) {}